

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi__decode_jpeg_header(stbi__jpeg *z,int scan)

{
  int a;
  ulong *puVar1;
  stbi__uint32 b;
  stbi__context *s;
  stbi_uc sVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  stbi__uint32 sVar6;
  uint uVar7;
  char *pcVar8;
  void *pvVar9;
  long lVar10;
  int extraout_EDX;
  int extraout_EDX_00;
  int iVar11;
  long lVar12;
  uint uVar13;
  int iVar14;
  int *piVar15;
  int iVar16;
  long in_FS_OFFSET;
  uint uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  int local_70;
  
  z->jfif = 0;
  z->app14_color_transform = -1;
  z->marker = 0xff;
  sVar2 = stbi__get_marker(z);
  if (sVar2 != 0xd8) {
    pcVar8 = "no SOI";
    goto LAB_0014bbc5;
  }
  if (scan == 1) {
    return 1;
  }
  bVar3 = stbi__get_marker(z);
  while ((bVar3 != 0xc2 && ((bVar3 & 0xfe) != 0xc0))) {
    iVar4 = stbi__process_marker(z,(uint)bVar3);
    if (iVar4 == 0) {
      return 0;
    }
    while (bVar3 = stbi__get_marker(z), bVar3 == 0xff) {
      iVar4 = stbi__at_eof(z->s);
      if (iVar4 != 0) {
        pcVar8 = "no SOF";
        goto LAB_0014bbc5;
      }
    }
  }
  z->progressive = (uint)(bVar3 == 0xc2);
  s = z->s;
  uVar5 = stbi__get16be(s);
  if (10 < uVar5) {
    sVar2 = stbi__get8(s);
    if (sVar2 != '\b') {
      pcVar8 = "only 8-bit";
      goto LAB_0014bbc5;
    }
    sVar6 = stbi__get16be(s);
    s->img_y = sVar6;
    if (sVar6 == 0) {
      pcVar8 = "no header height";
      goto LAB_0014bbc5;
    }
    sVar6 = stbi__get16be(s);
    s->img_x = sVar6;
    if (sVar6 == 0) {
      pcVar8 = "0 width";
      goto LAB_0014bbc5;
    }
    bVar3 = stbi__get8(s);
    if ((4 < bVar3) || ((0x1aU >> (bVar3 & 0x1f) & 1) == 0)) {
      pcVar8 = "bad component count";
      goto LAB_0014bbc5;
    }
    s->img_n = (uint)bVar3;
    for (lVar12 = 0; (ulong)(uint)bVar3 * 0x60 - lVar12 != 0; lVar12 = lVar12 + 0x60) {
      *(undefined8 *)((long)&z->img_comp[0].data + lVar12) = 0;
      *(undefined8 *)((long)&z->img_comp[0].linebuf + lVar12) = 0;
    }
    if (uVar5 == (uint)bVar3 * 3 + 8) {
      z->rgb = 0;
      piVar15 = &z->img_comp[0].tq;
      lVar12 = 0;
      do {
        uVar5 = s->img_n;
        if ((int)uVar5 <= lVar12) {
          if (scan != 0) {
            return 1;
          }
          sVar6 = s->img_x;
          b = s->img_y;
          iVar4 = stbi__mad3sizes_valid(sVar6,b,uVar5,0);
          if (iVar4 == 0) {
            *(char **)(in_FS_OFFSET + -0x10) = "too large";
            return 0;
          }
          auVar18._8_4_ = 1;
          auVar18._0_8_ = 0x100000001;
          auVar18._12_4_ = 1;
          lVar10 = (ulong)(~((int)uVar5 >> 0x1f) & uVar5) * 0x60;
          lVar12 = 0;
          while (lVar10 - lVar12 != 0) {
            puVar1 = (ulong *)((long)&z->img_comp[0].h + lVar12);
            lVar12 = lVar12 + 0x60;
            auVar19._8_8_ = 0;
            auVar19._0_8_ = *puVar1;
            auVar18 = vpmaxsd_avx(auVar19,auVar18);
          }
          uVar17 = auVar18._0_4_;
          uVar13 = auVar18._4_4_;
          z->img_h_max = (int)auVar18._0_8_;
          z->img_v_max = (int)((ulong)auVar18._0_8_ >> 0x20);
          lVar12 = 0;
          z->img_mcu_w = uVar17 * 8;
          z->img_mcu_h = uVar13 * 8;
          uVar5 = ((sVar6 - 1) + uVar17 * 8) / (uVar17 * 8);
          z->img_mcu_x = uVar5;
          uVar7 = ((b - 1) + uVar13 * 8) / (uVar13 * 8);
          z->img_mcu_y = uVar7;
          local_70 = 1;
          while( true ) {
            if (lVar10 == lVar12) {
              return 1;
            }
            iVar14 = *(int *)((long)&z->img_comp[0].h + lVar12);
            iVar11 = *(int *)((long)&z->img_comp[0].v + lVar12);
            *(uint *)((long)&z->img_comp[0].x + lVar12) = (iVar14 * sVar6 + (uVar17 - 1)) / uVar17;
            iVar14 = iVar14 * uVar5;
            iVar16 = iVar11 * uVar7;
            iVar4 = iVar16 * 8;
            a = iVar14 * 8;
            *(uint *)((long)&z->img_comp[0].y + lVar12) = (iVar11 * b + (uVar13 - 1)) / uVar13;
            *(int *)((long)&z->img_comp[0].w2 + lVar12) = a;
            *(int *)((long)&z->img_comp[0].h2 + lVar12) = iVar4;
            pvVar9 = stbi__malloc_mad2(a,iVar4,0xf);
            *(undefined8 *)((long)&z->img_comp[0].coeff + lVar12) = 0;
            *(undefined1 (*) [16])((long)&z->img_comp[0].raw_coeff + lVar12) = (undefined1  [16])0x0
            ;
            *(void **)((long)&z->img_comp[0].raw_data + lVar12) = pvVar9;
            iVar11 = extraout_EDX;
            if (pvVar9 == (void *)0x0) break;
            *(ulong *)((long)&z->img_comp[0].data + lVar12) =
                 (long)pvVar9 + 0xfU & 0xfffffffffffffff0;
            if (z->progressive != 0) {
              *(int *)((long)&z->img_comp[0].coeff_w + lVar12) = iVar14;
              *(int *)((long)&z->img_comp[0].coeff_h + lVar12) = iVar16;
              pvVar9 = stbi__malloc_mad3(a,iVar4,2,0xf);
              *(void **)((long)&z->img_comp[0].raw_coeff + lVar12) = pvVar9;
              iVar11 = extraout_EDX_00;
              if (pvVar9 == (void *)0x0) break;
              *(ulong *)((long)&z->img_comp[0].coeff + lVar12) =
                   (long)pvVar9 + 0xfU & 0xfffffffffffffff0;
            }
            local_70 = local_70 + 1;
            lVar12 = lVar12 + 0x60;
          }
          *(char **)(in_FS_OFFSET + -0x10) = "outofmem";
          stbi__free_jpeg_components(z,local_70,iVar11);
          return 0;
        }
        bVar3 = stbi__get8(s);
        ((anon_struct_96_18_0d0905d3 *)(piVar15 + -3))->id = (uint)bVar3;
        if ((s->img_n == 3) &&
           (bVar3 == (&stbi__process_frame_header(stbi__jpeg*,int)::rgb)[lVar12])) {
          z->rgb = z->rgb + 1;
        }
        bVar3 = stbi__get8(s);
        piVar15[-2] = (uint)(bVar3 >> 4);
        if ((byte)(bVar3 + 0xb0) < 0xc0) {
          pcVar8 = "bad H";
          goto LAB_0014bbc5;
        }
        piVar15[-1] = bVar3 & 0xf;
        if ((bVar3 & 0xf) - 5 < 0xfffffffc) {
          pcVar8 = "bad V";
          goto LAB_0014bbc5;
        }
        bVar3 = stbi__get8(s);
        lVar12 = lVar12 + 1;
        *piVar15 = (uint)bVar3;
        piVar15 = piVar15 + 0x18;
      } while (bVar3 < 4);
      pcVar8 = "bad TQ";
      goto LAB_0014bbc5;
    }
  }
  pcVar8 = "bad SOF len";
LAB_0014bbc5:
  *(char **)(in_FS_OFFSET + -0x10) = pcVar8;
  return 0;
}

Assistant:

static int stbi__decode_jpeg_header(stbi__jpeg *z, int scan)
{
   int m;
   z->jfif = 0;
   z->app14_color_transform = -1; // valid values are 0,1,2
   z->marker = STBI__MARKER_none; // initialize cached marker to empty
   m = stbi__get_marker(z);
   if (!stbi__SOI(m)) return stbi__err("no SOI","Corrupt JPEG");
   if (scan == STBI__SCAN_type) return 1;
   m = stbi__get_marker(z);
   while (!stbi__SOF(m)) {
      if (!stbi__process_marker(z,m)) return 0;
      m = stbi__get_marker(z);
      while (m == STBI__MARKER_none) {
         // some files have extra padding after their blocks, so ok, we'll scan
         if (stbi__at_eof(z->s)) return stbi__err("no SOF", "Corrupt JPEG");
         m = stbi__get_marker(z);
      }
   }
   z->progressive = stbi__SOF_progressive(m);
   if (!stbi__process_frame_header(z, scan)) return 0;
   return 1;
}